

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::EnhancedLayouts::SSBMemberInvalidOffsetAlignmentTest::isStageSupported
          (SSBMemberInvalidOffsetAlignmentTest *this,STAGES stage)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  TestError *this_00;
  GLint max_supported_buffers;
  int local_1c;
  
  iVar1 = (*((this->super_UniformBlockMemberInvalidOffsetAlignmentTest).super_NegativeTestBase.
             super_TestBase.super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_1c = 0;
  if (stage < STAGE_MAX) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x868))
              (*(undefined4 *)(&DAT_01a4cc48 + (ulong)stage * 4),&local_1c);
    err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
    glu::checkError(err,"GetIntegerv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                    ,0x2c3a);
    return 0 < local_1c;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Invalid enum",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
             ,0x2c36);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

bool SSBMemberInvalidOffsetAlignmentTest::isStageSupported(Utils::Shader::STAGES stage)
{
	const Functions& gl					   = m_context.getRenderContext().getFunctions();
	GLint			 max_supported_buffers = 0;
	GLenum			 pname				   = 0;

	switch (stage)
	{
	case Utils::Shader::COMPUTE:
		pname = GL_MAX_COMPUTE_SHADER_STORAGE_BLOCKS;
		break;
	case Utils::Shader::FRAGMENT:
		pname = GL_MAX_FRAGMENT_SHADER_STORAGE_BLOCKS;
		break;
	case Utils::Shader::GEOMETRY:
		pname = GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS;
		break;
	case Utils::Shader::TESS_CTRL:
		pname = GL_MAX_TESS_CONTROL_SHADER_STORAGE_BLOCKS;
		break;
	case Utils::Shader::TESS_EVAL:
		pname = GL_MAX_TESS_EVALUATION_SHADER_STORAGE_BLOCKS;
		break;
	case Utils::Shader::VERTEX:
		pname = GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS;
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	gl.getIntegerv(pname, &max_supported_buffers);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	return 1 <= max_supported_buffers;
}